

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

void __thiscall
snappy::SnappyDecompressor::DecompressAllTags<snappy::SnappyDecompressionValidator>
          (SnappyDecompressor *this,SnappyDecompressionValidator *writer)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  ulong in_RAX;
  ulong uVar6;
  undefined4 extraout_var;
  ulong uVar7;
  uint *puVar8;
  ulong uVar9;
  size_t n;
  ulong local_38;
  
  puVar8 = (uint *)this->ip_;
  local_38 = in_RAX;
  if ((long)this->ip_limit_ - (long)puVar8 < 5) {
    bVar4 = RefillTag(this);
    if (!bVar4) {
      return;
    }
    puVar8 = (uint *)this->ip_;
  }
  do {
    bVar1 = (byte)*puVar8;
    puVar8 = (uint *)((long)puVar8 + 1);
    if ((bVar1 & 3) == 0) {
      uVar7 = (ulong)(bVar1 >> 2) + 1;
      if (0xec < bVar1) {
        uVar7 = (ulong)((*(uint *)(char_table + uVar7 * 4 + 0x110) & *puVar8) + 1);
        puVar8 = (uint *)((long)puVar8 + ((ulong)(bVar1 >> 2) - 0x3b));
      }
      uVar9 = (long)this->ip_limit_ - (long)puVar8;
      if (uVar7 <= uVar9) {
LAB_00152eb8:
        uVar9 = writer->produced_ + uVar7;
        writer->produced_ = uVar9;
        if (writer->expected_ < uVar9) goto LAB_00152ec8;
        puVar8 = (uint *)((long)puVar8 + uVar7);
        goto LAB_00152ecf;
      }
      uVar6 = writer->produced_ + uVar9;
      writer->produced_ = uVar6;
      if (uVar6 <= writer->expected_) {
        do {
          (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
          iVar5 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
          puVar8 = (uint *)CONCAT44(extraout_var,iVar5);
          this->peeked_ = (uint32)local_38;
          if (local_38 == 0) break;
          uVar7 = uVar7 - uVar9;
          this->ip_limit_ = (char *)((long)puVar8 + local_38);
          if (uVar7 <= local_38) goto LAB_00152eb8;
          uVar6 = writer->produced_ + local_38;
          writer->produced_ = uVar6;
          uVar9 = local_38;
        } while (uVar6 <= writer->expected_);
      }
      bVar4 = false;
    }
    else {
      uVar2 = *(ushort *)(char_table + (ulong)bVar1 * 2);
      uVar3 = *puVar8;
      puVar8 = (uint *)((long)puVar8 + (ulong)(uVar2 >> 0xb));
      if (((ulong)((uVar2 & 0x700) + (*(uint *)(wordmask + (ulong)(uVar2 >> 0xb) * 4) & uVar3)) - 1
           < writer->produced_) &&
         (uVar7 = writer->produced_ + (ulong)(byte)uVar2, writer->produced_ = uVar7,
         uVar7 <= writer->expected_)) {
LAB_00152ecf:
        bVar4 = true;
        if ((long)this->ip_limit_ - (long)puVar8 < 5) {
          this->ip_ = (char *)puVar8;
          bVar4 = RefillTag(this);
          if (bVar4) {
            puVar8 = (uint *)this->ip_;
          }
        }
      }
      else {
LAB_00152ec8:
        bVar4 = false;
      }
    }
    if (bVar4 == false) {
      return;
    }
  } while( true );
}

Assistant:

void DecompressAllTags(Writer* writer) {
    const char* ip = ip_;

    // We could have put this refill fragment only at the beginning of the loop.
    // However, duplicating it at the end of each branch gives the compiler more
    // scope to optimize the <ip_limit_ - ip> expression based on the local
    // context, which overall increases speed.
    #define MAYBE_REFILL() \
        if (ip_limit_ - ip < kMaximumTagLength) { \
          ip_ = ip; \
          if (!RefillTag()) return; \
          ip = ip_; \
        }

    MAYBE_REFILL();
    for ( ;; ) {
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip++));

      if ((c & 0x3) == LITERAL) {
        size_t literal_length = (c >> 2) + 1u;
        if (writer->TryFastAppend(ip, ip_limit_ - ip, literal_length)) {
          assert(literal_length < 61);
          ip += literal_length;
          // NOTE(user): There is no MAYBE_REFILL() here, as TryFastAppend()
          // will not return true unless there's already at least five spare
          // bytes in addition to the literal.
          continue;
        }
        if (PREDICT_FALSE(literal_length >= 61)) {
          // Long literal.
          const size_t literal_length_length = literal_length - 60;
          literal_length =
              (LittleEndian::Load32(ip) & wordmask[literal_length_length]) + 1;
          ip += literal_length_length;
        }

        size_t avail = ip_limit_ - ip;
        while (avail < literal_length) {
          if (!writer->Append(ip, avail)) return;
          literal_length -= avail;
          reader_->Skip(peeked_);
          size_t n;
          ip = reader_->Peek(&n);
          avail = n;
          peeked_ = avail;
          if (avail == 0) return;  // Premature end of input
          ip_limit_ = ip + avail;
        }
        if (!writer->Append(ip, literal_length)) {
          return;
        }
        ip += literal_length;
        MAYBE_REFILL();
      } else {
        const uint32 entry = char_table[c];
        const uint32 trailer = LittleEndian::Load32(ip) & wordmask[entry >> 11];
        const uint32 length = entry & 0xff;
        ip += entry >> 11;

        // copy_offset/256 is encoded in bits 8..10.  By just fetching
        // those bits, we get copy_offset (since the bit-field starts at
        // bit 8).
        const uint32 copy_offset = entry & 0x700;
        if (!writer->AppendFromSelf(copy_offset + trailer, length)) {
          return;
        }
        MAYBE_REFILL();
      }
    }

#undef MAYBE_REFILL
  }